

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

void deqp::egl::initSurface(Functions *gl,IVec2 *oldSize)

{
  Vector<float,_3> local_110;
  Vector<int,_2> local_100;
  Vector<float,_3> local_f8;
  IVec2 local_e8;
  IVec2 local_e0;
  IVec2 local_d8;
  IVec2 local_d0;
  IVec2 local_c8;
  IVec2 local_c0;
  IVec2 local_b8;
  IVec2 local_b0;
  IVec2 local_a8;
  IVec2 local_a0;
  Vector<int,_2> local_98;
  IVec2 local_90;
  Vector<float,_3> local_88;
  Vector<float,_3> local_78;
  Vector<float,_3> local_6c;
  Vector<float,_3> local_60;
  Vector<float,_3> local_54;
  Vector<float,_3> local_48;
  Vector<float,_3> local_3c;
  
  local_88.m_data[0] = 0.0;
  local_88.m_data[1] = 0.0;
  local_f8.m_data[0] = 1.0;
  local_f8.m_data[1] = 0.0;
  local_f8.m_data[2] = 0.0;
  local_88.m_data[2] = 1.0;
  local_110.m_data[0] = 0.0;
  local_110.m_data[1] = 1.0;
  local_110.m_data[2] = 0.0;
  local_90.m_data[0] = 0;
  local_90.m_data[1] = 0;
  tcu::Vector<int,_2>::Vector(&local_98,oldSize);
  tcu::Vector<float,_3>::Vector(&local_3c,&local_88);
  drawRectangle(gl,&local_90,&local_98,&local_3c);
  local_a0.m_data[0] = 2;
  local_a0.m_data[1] = 2;
  local_100.m_data[0] = 4;
  local_100.m_data[1] = 4;
  tcu::operator-(oldSize,&local_100);
  tcu::Vector<float,_3>::Vector(&local_48,&local_f8);
  drawRectangle(gl,&local_a0,&local_a8,&local_48);
  local_b0.m_data[0] = 0;
  local_b0.m_data[1] = 0;
  local_b8.m_data[0] = 8;
  local_b8.m_data[1] = 4;
  tcu::Vector<float,_3>::Vector(&local_54,&local_110);
  drawRectangle(gl,&local_b0,&local_b8,&local_54);
  local_100.m_data[0] = 0x10;
  local_100.m_data[1] = 0x10;
  tcu::operator-(oldSize,&local_100);
  local_c8.m_data[0] = 8;
  local_c8.m_data[1] = 4;
  tcu::Vector<float,_3>::Vector(&local_60,&local_110);
  drawRectangle(gl,&local_c0,&local_c8,&local_60);
  local_d0.m_data[0] = 0;
  local_d0.m_data[1] = oldSize->m_data[1] + -0x10;
  local_d8.m_data[0] = 8;
  local_d8.m_data[1] = 4;
  tcu::Vector<float,_3>::Vector(&local_6c,&local_110);
  drawRectangle(gl,&local_d0,&local_d8,&local_6c);
  local_e0.m_data[0] = oldSize->m_data[0] + -0x10;
  local_e0.m_data[1] = 0;
  local_e8.m_data[0] = 8;
  local_e8.m_data[1] = 4;
  tcu::Vector<float,_3>::Vector(&local_78,&local_110);
  drawRectangle(gl,&local_e0,&local_e8,&local_78);
  return;
}

Assistant:

void initSurface (const glw::Functions& gl, IVec2 oldSize)
{
	const Vec3	frameColor	(0.0f, 0.0f, 1.0f);
	const Vec3	fillColor	(1.0f, 0.0f, 0.0f);
	const Vec3	markColor	(0.0f, 1.0f, 0.0f);

	drawRectangle(gl, IVec2(0, 0), oldSize, frameColor);
	drawRectangle(gl, IVec2(2, 2), oldSize - IVec2(4, 4), fillColor);

	drawRectangle(gl, IVec2(0, 0), IVec2(8, 4), markColor);
	drawRectangle(gl, oldSize - IVec2(16, 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(0, oldSize.y() - 16), IVec2(8, 4), markColor);
	drawRectangle(gl, IVec2(oldSize.x() - 16, 0), IVec2(8, 4), markColor);
}